

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.cpp
# Opt level: O3

size_t sznet::detail::convert<int>(char *buf,int value)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  uint uVar5;
  char *pcVar6;
  bool bVar7;
  
  pcVar3 = buf;
  iVar2 = value;
  do {
    pcVar4 = pcVar3;
    uVar5 = iVar2 + 9;
    *pcVar4 = *(char *)(zero + iVar2 % 10);
    pcVar3 = pcVar4 + 1;
    iVar2 = iVar2 / 10;
  } while (0x12 < uVar5);
  if (value < 0) {
    *pcVar3 = '-';
    pcVar3 = pcVar4 + 2;
  }
  *pcVar3 = '\0';
  pcVar4 = pcVar3 + -1;
  if (buf < pcVar4 && (long)pcVar3 - (long)buf != 0) {
    pcVar6 = buf + 1;
    do {
      cVar1 = pcVar6[-1];
      pcVar6[-1] = *pcVar4;
      *pcVar4 = cVar1;
      pcVar4 = pcVar4 + -1;
      bVar7 = pcVar6 < pcVar4;
      pcVar6 = pcVar6 + 1;
    } while (bVar7);
  }
  return (long)pcVar3 - (long)buf;
}

Assistant:

size_t convert(char buf[], T value)
	{
		T i = value;
		char* p = buf;
		// 201 分别取数字 1 0 2
		do
		{
			int lsd = static_cast<int>(i % 10);
			i /= 10;
			*p++ = zero[lsd];
		} while (i != 0);
		// 判断 value 是否为负数
		if (value < 0)
		{
			*p++ = '-';
		}
		*p = '\0';
		// 反转
		std::reverse(buf, p);
		// 返回转换后的长度
		return p - buf;
	}